

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::Impl::loadModule(Impl *this,ReadableDirectory *dir,PathPtr path)

{
  _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  _Hash_node_base *p_Var1;
  __node_base_ptr p_Var2;
  ReadableFile *pRVar3;
  Maybe<const_kj::ReadableFile_&> MVar4;
  uint64_t uVar5;
  __node_ptr p_Var6;
  __node_ptr p_Var7;
  __node_ptr p_Var8;
  ReadableDirectory *__s;
  __node_base_ptr p_Var9;
  ModuleImpl *pMVar10;
  int __flags;
  String *pSVar11;
  String *params_2;
  void *__child_stack;
  ulong uVar12;
  _func_int **__n;
  ulong uVar13;
  _Hash_node_base *p_Var14;
  void *in_R8;
  void *__arg;
  ulong __c;
  undefined1 auVar15 [16];
  __buckets_alloc_type __alloc;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_e8;
  Impl *local_d0;
  Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> module;
  _Scoped_node local_b8;
  _func_int **local_a8;
  Path pathCopy;
  PathPtr path_local;
  key_type local_78;
  Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> local_40;
  
  pSVar11 = (String *)path.parts.size_;
  params_2 = path.parts.ptr;
  this_00 = (_Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(dir + 5);
  local_78.file.ptr = (ReadableFile *)0x0;
  local_78.hashCode = 0;
  local_78.size = 0;
  local_78.lastModified.value.value = (Quantity<long,_kj::_::NanosecondLabel>)0;
  __arg = in_R8;
  path_local.parts.ptr = pSVar11;
  local_78.baseDir = (ReadableDirectory *)params_2;
  local_78.path.parts.ptr = pSVar11;
  local_78.path.parts.size_ = (size_t)in_R8;
  p_Var6 = std::
           _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(this_00,0,&local_78,0);
  if (p_Var6 == (__node_ptr)0x0) {
    (**(_func_int **)((long)(params_2->content).ptr + 0x50))(&local_78,params_2,pSVar11);
    __flags = (int)in_R8;
    local_e8.disposer = (Disposer *)local_78.baseDir;
    local_e8.ptr = (ReadableFile *)local_78.path.parts.ptr;
    local_78.path.parts.ptr = (String *)0x0;
    kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&local_78);
    if ((String *)local_e8.ptr == (String *)0x0) {
      this->errorReporter = (GlobalErrorReporter *)0x0;
    }
    else {
      kj::PathPtr::clone((PathPtr *)&pathCopy,(__fn *)&path_local,__child_stack,__flags,__arg);
      pRVar3 = local_e8.ptr;
      local_d0 = this;
      (**(code **)(((Array<char> *)&(local_e8.ptr)->super_FsNode)->ptr + 0x10))
                (&local_78,local_e8.ptr);
      uVar5 = local_78.size;
      MVar4.ptr = local_78.file.ptr;
      pSVar11 = local_78.path.parts.ptr;
      kj::
      heap<capnp::compiler::ModuleLoader::ModuleImpl,capnp::compiler::ModuleLoader::Impl&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::ReadableDirectory_const&,kj::Path>
                ((kj *)&module,(Impl *)dir,&local_e8,(ReadableDirectory *)params_2,&pathCopy);
      pMVar10 = module.ptr;
      local_78.path.parts.ptr = pathCopy.parts.ptr;
      local_78.path.parts.size_ = pathCopy.parts.size_;
      local_78.file.ptr = pRVar3;
      local_78.hashCode = uVar5;
      local_78.size = (uint64_t)pSVar11;
      local_78.lastModified.value.value =
           (Quantity<long,_kj::_::NanosecondLabel>)(Quantity<long,_kj::_::NanosecondLabel>)MVar4.ptr
      ;
      local_40.disposer = module.disposer;
      local_40.ptr = module.ptr;
      module.ptr = (ModuleImpl *)0x0;
      local_b8._M_h = (__hashtable_alloc *)this_00;
      local_78.baseDir = (ReadableDirectory *)params_2;
      p_Var7 = (__node_ptr)operator_new(0x58);
      MVar4.ptr = local_78.file.ptr;
      (p_Var7->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      *(ReadableDirectory **)
       &(p_Var7->
        super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
        ).
        super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
        ._M_storage._M_storage = local_78.baseDir;
      *(String **)
       ((long)&(p_Var7->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 8) = local_78.path.parts.ptr;
      local_78.file.ptr = (ReadableFile *)0x0;
      *(size_t *)
       ((long)&(p_Var7->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x10) = local_78.path.parts.size_;
      *(ReadableFile **)
       ((long)&(p_Var7->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x18) = MVar4.ptr;
      *(Quantity<long,_kj::_::NanosecondLabel> *)
       ((long)&(p_Var7->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x30) = local_78.lastModified.value.value;
      *(uint64_t *)
       ((long)&(p_Var7->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x20) = local_78.hashCode;
      *(uint64_t *)
       ((long)&(p_Var7->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x28) = local_78.size;
      *(Disposer **)
       ((long)&(p_Var7->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x38) = local_40.disposer;
      *(ModuleImpl **)
       ((long)&(p_Var7->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x40) = local_40.ptr;
      local_40.ptr = (ModuleImpl *)0x0;
      __c = *(long *)((long)&(p_Var7->
                             super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                             ._M_storage._M_storage + 0x20) +
            *(long *)((long)&(p_Var7->
                             super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                             ._M_storage._M_storage + 0x30) * 0x49 +
            *(long *)((long)&(p_Var7->
                             super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                             ._M_storage._M_storage + 0x28) * 0x67;
      uVar12 = __c % (ulong)dir[6].super_FsNode._vptr_FsNode;
      local_b8._M_node = p_Var7;
      p_Var8 = std::
               _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_node(this_00,uVar12,
                              (key_type *)
                              &p_Var7->
                               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                              ,__c);
      p_Var6 = p_Var8;
      if (p_Var8 == (__node_ptr)0x0) {
        local_a8 = dir[10].super_FsNode._vptr_FsNode;
        auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)(dir + 9),(ulong)dir[6].super_FsNode._vptr_FsNode,
                             (ulong)dir[8].super_FsNode._vptr_FsNode);
        __n = auVar15._8_8_;
        if ((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __s = (ReadableDirectory *)this_00->_M_buckets;
        }
        else {
          if (__n == (_func_int **)0x1) {
            __s = dir + 0xb;
            dir[0xb].super_FsNode._vptr_FsNode = (_func_int **)0x0;
          }
          else {
            __s = (ReadableDirectory *)
                  std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                            (&__alloc,(size_type)__n);
            memset(__s,0,(long)__n * 8);
          }
          p_Var2 = (__node_base_ptr)(dir + 7);
          p_Var1 = (_Hash_node_base *)dir[7].super_FsNode._vptr_FsNode;
          dir[7].super_FsNode._vptr_FsNode = (_func_int **)0x0;
          uVar12 = 0;
LAB_00113b6f:
          p_Var14 = p_Var1;
          uVar13 = uVar12;
          if (p_Var14 != (_Hash_node_base *)0x0) {
            p_Var1 = p_Var14->_M_nxt;
            uVar12 = (ulong)p_Var14[10]._M_nxt % (ulong)__n;
            p_Var9 = (__node_base_ptr)__s[uVar12].super_FsNode._vptr_FsNode;
            if (p_Var9 == (__node_base_ptr)0x0) goto LAB_00113ba0;
            p_Var14->_M_nxt = p_Var9->_M_nxt;
            p_Var9 = (__node_base_ptr)__s[uVar12].super_FsNode._vptr_FsNode;
            uVar12 = uVar13;
            goto LAB_00113bbf;
          }
          std::
          _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_deallocate_buckets(this_00);
          dir[6].super_FsNode._vptr_FsNode = __n;
          dir[5].super_FsNode._vptr_FsNode = (_func_int **)__s;
          uVar12 = __c % (ulong)__n;
        }
        (p_Var7->
        super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
        ).super__Hash_node_code_cache<true>._M_hash_code = __c;
        p_Var2 = (__node_base_ptr)__s[uVar12].super_FsNode._vptr_FsNode;
        if (p_Var2 == (__node_base_ptr)0x0) {
          p_Var1 = (_Hash_node_base *)dir[7].super_FsNode._vptr_FsNode;
          (p_Var7->super__Hash_node_base)._M_nxt = p_Var1;
          dir[7].super_FsNode._vptr_FsNode = (_func_int **)p_Var7;
          if (p_Var1 != (_Hash_node_base *)0x0) {
            __s[(ulong)p_Var1[10]._M_nxt % (ulong)dir[6].super_FsNode._vptr_FsNode].super_FsNode.
            _vptr_FsNode = (_func_int **)p_Var7;
            __s = (ReadableDirectory *)dir[5].super_FsNode._vptr_FsNode;
          }
          __s[uVar12].super_FsNode._vptr_FsNode = (_func_int **)(dir + 7);
        }
        else {
          (p_Var7->super__Hash_node_base)._M_nxt = p_Var2->_M_nxt;
          ((__node_base_ptr)__s[uVar12].super_FsNode._vptr_FsNode)->_M_nxt =
               (_Hash_node_base *)p_Var7;
        }
        dir[8].super_FsNode._vptr_FsNode =
             (_func_int **)((long)dir[8].super_FsNode._vptr_FsNode + 1);
        local_b8._M_node = (__node_ptr)0x0;
        p_Var6 = p_Var7;
      }
      std::
      _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Scoped_node::~_Scoped_node(&local_b8);
      kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t>::dispose(&local_40);
      if (p_Var8 != (__node_ptr)0x0) {
        pMVar10 = *(ModuleImpl **)
                   ((long)&(p_Var6->
                           super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                           ._M_storage._M_storage + 0x40);
      }
      ((ErrorReporter *)&local_d0->errorReporter)->_vptr_ErrorReporter = (_func_int **)pMVar10;
      kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t>::dispose(&module);
      kj::Array<kj::String>::~Array(&pathCopy.parts);
      this = local_d0;
    }
    kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&local_e8);
  }
  else {
    this->errorReporter =
         *(GlobalErrorReporter **)
          ((long)&(p_Var6->
                  super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                  ._M_storage._M_storage + 0x40);
  }
  return (Maybe<capnp::compiler::Module_&>)(Module *)this;
LAB_00113ba0:
  p_Var14->_M_nxt = p_Var2->_M_nxt;
  p_Var2->_M_nxt = p_Var14;
  __s[uVar12].super_FsNode._vptr_FsNode = (_func_int **)p_Var2;
  if (p_Var14->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var9 = (__node_base_ptr)(__s + uVar13);
LAB_00113bbf:
    p_Var9->_M_nxt = p_Var14;
  }
  goto LAB_00113b6f;
}

Assistant:

kj::Maybe<Module&> ModuleLoader::Impl::loadModule(
    const kj::ReadableDirectory& dir, kj::PathPtr path) {
  auto iter = modules.find(FileKey(dir, path));
  if (iter != modules.end()) {
    // Return existing file.
    return *iter->second;
  }

  KJ_IF_SOME(file, dir.tryOpenFile(path)) {
    auto pathCopy = path.clone();
    auto key = FileKey(dir, pathCopy, *file);
    auto module = kj::heap<ModuleImpl>(*this, kj::mv(file), dir, kj::mv(pathCopy));
    auto& result = *module;
    auto insertResult = modules.insert(std::make_pair(key, kj::mv(module)));
    if (insertResult.second) {
      return result;
    } else {
      // Now that we have the file open, we noticed a collision. Return the old file.
      return *insertResult.first->second;
    }
  } else {
    // No such file.
    return kj::none;
  }